

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_test.cc
# Opt level: O0

int hash_cmp(hash_elem *a,hash_elem *b)

{
  avl_node **ppaVar1;
  avl_node **ppaVar2;
  item *bb;
  item *aa;
  hash_elem *b_local;
  hash_elem *a_local;
  int local_4;
  
  ppaVar1 = &a[-1].avl.right;
  ppaVar2 = &b[-1].avl.right;
  if (*(int *)ppaVar1 < *(int *)ppaVar2) {
    local_4 = -1;
  }
  else if (*(int *)ppaVar2 < *(int *)ppaVar1) {
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int hash_cmp(struct hash_elem *a, struct hash_elem *b)
{
    struct item *aa, *bb;
    aa = _get_entry(a, struct item, e);
    bb = _get_entry(b, struct item, e);
    if (aa->val < bb->val) return -1;
    else if (aa->val > bb->val) return 1;
    else return 0;
}